

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void isDate(char *attrName,char *str)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *in_RSI;
  bool leapYear;
  int s;
  int m;
  int h;
  int D;
  int M;
  int Y;
  char *in_stack_000001a0;
  bool local_2b;
  
  sVar7 = strlen(in_RSI);
  if (((((sVar7 != 0x13) || (in_RSI[4] != ':')) || (in_RSI[7] != ':')) ||
      ((in_RSI[10] != ' ' || (in_RSI[0xd] != ':')))) || (in_RSI[0x10] != ':')) {
    notValidDate(in_stack_000001a0);
  }
  iVar1 = strToInt(in_RSI,4);
  iVar2 = strToInt(in_RSI + 5,2);
  iVar3 = strToInt(in_RSI + 8,2);
  iVar4 = strToInt(in_RSI + 0xb,2);
  iVar5 = strToInt(in_RSI + 0xe,2);
  iVar6 = strToInt(in_RSI + 0x11,2);
  if (((((iVar1 < 0) || (iVar2 < 1)) ||
       ((0xc < iVar2 || (((iVar3 < 1 || (iVar4 < 0)) || (0x17 < iVar4)))))) ||
      ((iVar5 < 0 || (0x3b < iVar5)))) || ((iVar6 < 0 || (0x3b < iVar6)))) {
    notValidDate(in_stack_000001a0);
  }
  if (iVar2 == 2) {
    local_2b = false;
    if (iVar1 % 4 == 0) {
      local_2b = iVar1 % 100 != 0 || iVar1 % 400 == 0;
    }
    iVar1 = 0x1c;
    if (local_2b) {
      iVar1 = 0x1d;
    }
    if (iVar1 < iVar3) {
      notValidDate(in_stack_000001a0);
    }
  }
  else if (((iVar2 == 4) || (iVar2 == 6)) || ((iVar2 == 9 || (iVar2 == 0xb)))) {
    if (0x1e < iVar3) {
      notValidDate(in_stack_000001a0);
    }
  }
  else if (0x1f < iVar3) {
    notValidDate(in_stack_000001a0);
  }
  return;
}

Assistant:

void
isDate (const char attrName[], const char str[])
{
    //
    // Check that str represents a valid
    // date of the form YYYY:MM:DD hh:mm:ss.
    //

    if (strlen (str) != 19 || str[4] != ':' || str[7] != ':' ||
        str[10] != ' ' || str[13] != ':' || str[16] != ':')
    {
        notValidDate (attrName);
    }

    int Y = strToInt (str + 0, 4);  // year
    int M = strToInt (str + 5, 2);  // month
    int D = strToInt (str + 8, 2);  // day
    int h = strToInt (str + 11, 2); // hour
    int m = strToInt (str + 14, 2); // minute
    int s = strToInt (str + 17, 2); // second

    if (Y < 0 || M < 1 || M > 12 || D < 1 || h < 0 || h > 23 || m < 0 ||
        m > 59 || s < 0 || s > 59)
    {
        notValidDate (attrName);
    }

    if (M == 2)
    {
        bool leapYear = (Y % 4 == 0) && (Y % 100 != 0 || Y % 400 == 0);

        if (D > (leapYear ? 29 : 28)) notValidDate (attrName);
    }
    else if (M == 4 || M == 6 || M == 9 || M == 11)
    {
        if (D > 30) notValidDate (attrName);
    }
    else
    {
        if (D > 31) notValidDate (attrName);
    }
}